

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.c
# Opt level: O0

void update_joyaxis(uint8_t axis,int16_t value)

{
  int16_t iVar1;
  int16_t iVar2;
  int iVar3;
  KEYINPUT_t *pKVar4;
  int16_t in_SI;
  char in_DIL;
  double dVar5;
  double degrees;
  double adjusted_joyy;
  double adjusted_joyx;
  KEYINPUT_t *KEYINPUT;
  bool local_30;
  bool local_2f;
  bool local_2e;
  bool local_2d;
  double local_28;
  
  pKVar4 = get_keyinput();
  iVar1 = in_SI;
  iVar2 = joyy;
  if ((in_DIL != '\0') && (iVar1 = joyx, iVar2 = in_SI, in_DIL != '\x01')) {
    iVar2 = joyy;
  }
  joyy = iVar2;
  joyx = iVar1;
  iVar3 = (int)joyx;
  if (iVar3 < 1) {
    iVar3 = -iVar3;
  }
  if (iVar3 < 8000) {
    iVar3 = (int)joyy;
    if (iVar3 < 1) {
      iVar3 = -iVar3;
    }
    if (iVar3 < 8000) {
      pKVar4->raw = pKVar4->raw & 0xffdf | 0x20;
      pKVar4->raw = pKVar4->raw & 0xffef | 0x10;
      pKVar4->raw = pKVar4->raw & 0xffbf | 0x40;
      pKVar4->raw = pKVar4->raw & 0xff7f | 0x80;
      return;
    }
  }
  dVar5 = atan2((double)(int)joyy / -32768.0,(double)(int)joyx * 3.0517578125e-05);
  local_28 = (dVar5 * 180.0) / 3.141592653589793;
  if (local_28 < 0.0) {
    local_28 = local_28 + 360.0;
  }
  local_2d = 22.5 < local_28 && local_28 < 157.5;
  pKVar4->raw = pKVar4->raw & 0xffbf | (ushort)((local_2d ^ 0xffU) & 1) << 6;
  local_2e = 202.5 < local_28 && local_28 < 337.5;
  pKVar4->raw = pKVar4->raw & 0xff7f | (ushort)((local_2e ^ 0xffU) & 1) << 7;
  local_2f = 112.5 < local_28 && local_28 < 247.5;
  pKVar4->raw = pKVar4->raw & 0xffdf | (ushort)((local_2f ^ 0xffU) & 1) << 5;
  local_30 = local_28 < 67.5 || 292.5 < local_28;
  pKVar4->raw = pKVar4->raw & 0xffef | (ushort)((local_30 ^ 0xffU) & 1) << 4;
  return;
}

Assistant:

void update_joyaxis(byte axis, int16_t value) {
    KEYINPUT_t* KEYINPUT = get_keyinput();
    switch (axis) {
        case SDL_CONTROLLER_AXIS_LEFTX:
            joyx = value;
            break;
        case SDL_CONTROLLER_AXIS_LEFTY:
            joyy = value;
            break;
        default:
            break;
    }

    if (abs(joyx) < 8000 && abs(joyy) < 8000) {
        KEYINPUT->left = true;
        KEYINPUT->right = true;
        KEYINPUT->up = true;
        KEYINPUT->down = true;
    } else {

        // normalize to unit circle
        double adjusted_joyx = (double)joyx / 32768;
        double adjusted_joyy = (double)joyy / -32768; // y axis is reversed from what you'd expect, so flip it back with this division

        // what direction are we pointing?
        double degrees = atan2(adjusted_joyy, adjusted_joyx) * 180 / M_PI;

        // atan2 returns negative numbers for values > 180
        if (degrees < 0) {
            degrees = 360 + degrees;
        }

        // 135 degree slices, overlapping.
        KEYINPUT->up = !CHECKSLICE(degrees, 90);
        KEYINPUT->down = !CHECKSLICE(degrees, 270);
        KEYINPUT->left = !CHECKSLICE(degrees, 180);
        // Slightly different since it's around the 0 angle
        KEYINPUT->right = !(degrees < SLICE_OFFSET || degrees > (360 - SLICE_OFFSET));
    }
}